

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void heightOfExprList(ExprList *p,int *pnHeight)

{
  int *in_RSI;
  int *in_RDI;
  int i;
  int local_14;
  
  if (in_RDI != (int *)0x0) {
    for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
      heightOfExpr(*(Expr **)(in_RDI + (long)local_14 * 8 + 2),in_RSI);
    }
  }
  return;
}

Assistant:

static void heightOfExprList(ExprList *p, int *pnHeight){
  if( p ){
    int i;
    for(i=0; i<p->nExpr; i++){
      heightOfExpr(p->a[i].pExpr, pnHeight);
    }
  }
}